

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int walIndexReadHdr(Wal *pWal,int *pChanged)

{
  u8 uVar1;
  u32 uVar2;
  uint uVar3;
  u32 *puVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  u8 *aFrame;
  long lVar9;
  uint uVar10;
  u32 *puVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  bool bVar16;
  u32 pgno;
  u32 *page0;
  i64 nSize;
  u32 *aShare;
  u8 aBuf [32];
  u32 local_d0;
  u32 local_cc;
  long local_c8;
  u32 *local_c0;
  ulong local_b8;
  ulong local_b0;
  u8 *local_a8;
  long local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  u32 *local_60;
  undefined4 local_58;
  uint local_54;
  undefined4 local_50;
  uint local_4c;
  undefined8 local_48;
  uint local_40;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pWal->nWiData < 1) {
LAB_0012c9b7:
    iVar5 = walIndexPageRealloc(pWal,0,&local_c0);
    if (iVar5 != 0) {
      if (iVar5 != 0x508) goto LAB_0012d294;
      pWal->bShmUnreliable = '\x01';
      pWal->exclusiveMode = '\x02';
      *pChanged = 1;
    }
    if (local_c0 != (u32 *)0x0) goto LAB_0012c9f1;
LAB_0012ca04:
    if ((pWal->bShmUnreliable == '\0') && ((pWal->readOnly & 2) != 0)) {
      iVar6 = 0x108;
      iVar5 = iVar6;
      if (((pWal->exclusiveMode == '\0') &&
          (iVar5 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,6), iVar5 == 0)) &&
         (iVar5 = iVar6, pWal->exclusiveMode == '\0')) {
        (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,5);
      }
    }
    else {
      uVar1 = pWal->writeLock;
      if ((uVar1 != '\0') ||
         ((pWal->exclusiveMode != '\0' ||
          (iVar5 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,10), iVar5 == 0)))) {
        pWal->writeLock = '\x01';
        if ((pWal->nWiData < 1) || (local_c0 = *pWal->apWiData, local_c0 == (u32 *)0x0)) {
          bVar16 = false;
          iVar5 = walIndexPageRealloc(pWal,0,&local_c0);
          if (iVar5 == 0) goto LAB_0012ca5f;
        }
        else {
LAB_0012ca5f:
          iVar5 = walIndexTryHdr(pWal,pChanged);
          if (iVar5 == 0) {
            bVar16 = true;
            iVar5 = 0;
          }
          else {
            iVar14 = 2 - (uint)pWal->ckptLock;
            iVar6 = pWal->ckptLock + 1;
            if ((pWal->exclusiveMode != '\0') ||
               (iVar5 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar6,iVar14,10), iVar5 == 0)
               ) {
              (pWal->hdr).aSalt[0] = 0;
              (pWal->hdr).aSalt[1] = 0;
              (pWal->hdr).aCksum[0] = 0;
              (pWal->hdr).aCksum[1] = 0;
              (pWal->hdr).mxFrame = 0;
              (pWal->hdr).nPage = 0;
              (pWal->hdr).aFrameCksum[0] = 0;
              (pWal->hdr).aFrameCksum[1] = 0;
              local_98 = 0;
              uStack_90 = 0;
              (pWal->hdr).iVersion = 0;
              (pWal->hdr).unused = 0;
              (pWal->hdr).iChange = 0;
              (pWal->hdr).isInit = '\0';
              (pWal->hdr).bigEndCksum = '\0';
              (pWal->hdr).szPage = 0;
              iVar5 = (*pWal->pWalFd->pMethods->xFileSize)(pWal->pWalFd,&local_a0);
              if (iVar5 == 0) {
                if (0x20 < local_a0) {
                  iVar5 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,&local_58,0x20,0);
                  if (iVar5 != 0) goto LAB_0012d1c1;
                  if ((local_58._3_1_ & 0xfffffffe |
                      (local_58 >> 0x10 & 0xff) << 8 |
                      (local_58 >> 8 & 0xff) << 0x10 | local_58 << 0x18) == 0x377f0682) {
                    local_c8 = (ulong)local_50._1_1_ << 0x10;
                    iVar7 = local_50 * 0x1000000 + (int)local_c8;
                    uVar10 = (local_50 >> 0x10 & 0xff) * 0x100;
                    uVar12 = (uint)local_50._3_1_ + iVar7 | uVar10;
                    if (0xffff01fe < uVar12 - 0x10001 && (uVar12 & uVar12 - 1) == 0) {
                      (pWal->hdr).bigEndCksum = (u8)(local_58._3_1_ & 1);
                      pWal->szPage = uVar12;
                      pWal->nCkpt = local_4c >> 0x18 | (local_4c & 0xff0000) >> 8 |
                                    (local_4c & 0xff00) << 8 | local_4c << 0x18;
                      *(undefined8 *)(pWal->hdr).aSalt = local_48;
                      walChecksumBytes(local_58._3_1_ & 1 ^ 1,(u8 *)&local_58,0x18,(u32 *)0x0,
                                       (pWal->hdr).aFrameCksum);
                      if (((pWal->hdr).aFrameCksum[0] ==
                           (local_40 >> 0x18 | (local_40 & 0xff0000) >> 8 | (local_40 & 0xff00) << 8
                           | local_40 << 0x18)) &&
                         ((pWal->hdr).aFrameCksum[1] ==
                          (local_3c >> 0x18 | (local_3c & 0xff0000) >> 8 | (local_3c & 0xff00) << 8
                          | local_3c << 0x18))) {
                        if ((local_54 >> 0x18 | (local_54 & 0xff0000) >> 8 |
                             (local_54 & 0xff00) << 8 | local_54 << 0x18) == 0x2de218) {
                          iVar8 = sqlite3_initialize();
                          iVar5 = 7;
                          if (iVar8 == 0) {
                            local_b8 = (ulong)(uVar12 + 0x18);
                            aFrame = (u8 *)sqlite3Malloc(local_b8 + 0x8000);
                            if (aFrame != (u8 *)0x0) {
                              puVar11 = (u32 *)(aFrame + (ulong)uVar12 + 0x18);
                              local_a8 = aFrame + 0x18;
                              local_78 = (local_a0 + -0x20) / (long)local_b8;
                              local_80 = (ulong)((int)local_78 + 0x1000) + 0xffffffff021 >> 0xc;
                              local_78 = local_78 & 0xffffffff;
                              local_b0 = (ulong)(local_50 * 0x1000000 + (int)local_c8 + uVar10 +
                                                 (uint)local_50._3_1_ + 0x18);
                              local_98 = 0;
                              uStack_90 = 0;
                              uVar15 = 0;
                              uVar12 = 0;
                              do {
                                local_68 = uVar15 + 0xfde;
                                if (local_78 <= uVar15 + 0xfde) {
                                  local_68 = local_78;
                                }
                                uVar13 = (ulong)(uVar12 * 0x1000 + 0xfde);
                                if (local_78 < uVar13) {
                                  uVar13 = local_78;
                                }
                                local_70 = uVar15;
                                iVar5 = walIndexPage(pWal,uVar12,&local_60);
                                puVar4 = local_60;
                                if (local_60 == (u32 *)0x0) break;
                                uVar3 = uVar12 * 0x1000 - 0x21;
                                if (uVar12 == 0) {
                                  uVar3 = 1;
                                }
                                pWal->apWiData[uVar12] = puVar11;
                                if ((uint)uVar13 < uVar3) {
                                  pWal->apWiData[uVar12] = local_60;
                                  lVar9 = 0;
                                  if (uVar12 == 0) {
                                    lVar9 = 0x88;
                                  }
                                  memcpy((void *)((long)local_60 + lVar9),
                                         (u8 *)((long)puVar11 + lVar9),0x8000 - lVar9);
                                  iVar8 = iVar5;
                                }
                                else {
                                  uVar15 = (ulong)uVar3;
                                  iVar5 = (*pWal->pWalFd->pMethods->xRead)
                                                    (pWal->pWalFd,aFrame,(int)local_b8,
                                                     (uVar15 - 1) * local_b8 + 0x20);
                                  if (iVar5 != 0) {
                                    pWal->apWiData[uVar12] = puVar4;
                                    lVar9 = 0x88;
                                    if (uVar12 != 0) {
                                      lVar9 = 0;
                                    }
                                    memcpy((void *)((long)puVar4 + lVar9),
                                           (u8 *)((long)puVar11 + lVar9),0x8000 - lVar9);
                                    break;
                                  }
                                  iVar5 = walDecodeFrame(pWal,&local_cc,&local_d0,local_a8,aFrame);
                                  if (iVar5 == 0) {
                                    bVar16 = false;
                                  }
                                  else {
                                    local_c8 = local_b0 * uVar15 + 0x20;
                                    bVar16 = false;
                                    do {
                                      iVar5 = walIndexAppend(pWal,(u32)uVar15,local_cc);
                                      lVar9 = local_c8;
                                      if (iVar5 != 0) goto LAB_0012cefa;
                                      if (local_d0 != 0) {
                                        (pWal->hdr).mxFrame = (u32)uVar15;
                                        (pWal->hdr).nPage = local_d0;
                                        (pWal->hdr).szPage =
                                             (ushort)((uint)iVar7 >> 0x10) | (ushort)uVar10;
                                        local_98 = *(undefined8 *)(pWal->hdr).aFrameCksum;
                                        uStack_90 = 0;
                                      }
                                      bVar16 = uVar13 <= uVar15;
                                      if (local_68 == uVar15) {
                                        iVar5 = 0;
                                        pWal->apWiData[uVar12] = puVar4;
                                        lVar9 = 0;
                                        if (uVar12 == 0) {
                                          lVar9 = 0x88;
                                        }
                                        memcpy((void *)((long)puVar4 + lVar9),
                                               (u8 *)((long)puVar11 + lVar9),0x8000 - lVar9);
                                        iVar8 = 0;
                                        if (uVar15 < uVar13) goto LAB_0012d0dc;
                                        goto LAB_0012cf49;
                                      }
                                      iVar5 = (*pWal->pWalFd->pMethods->xRead)
                                                        (pWal->pWalFd,aFrame,(int)local_b8,local_c8)
                                      ;
                                      if (iVar5 != 0) goto LAB_0012cefa;
                                      iVar5 = walDecodeFrame(pWal,&local_cc,&local_d0,local_a8,
                                                             aFrame);
                                      local_c8 = lVar9 + local_b0;
                                      uVar15 = uVar15 + 1;
                                    } while (iVar5 != 0);
                                  }
                                  iVar5 = 0;
LAB_0012cefa:
                                  pWal->apWiData[uVar12] = puVar4;
                                  lVar9 = 0;
                                  if (uVar12 == 0) {
                                    lVar9 = 0x88;
                                  }
                                  memcpy((void *)((long)puVar4 + lVar9),
                                         (u8 *)((long)puVar11 + lVar9),0x8000 - lVar9);
                                  iVar8 = iVar5;
                                  if (!bVar16) break;
                                }
LAB_0012cf49:
                                iVar5 = iVar8;
                                uVar12 = uVar12 + 1;
                                uVar15 = (ulong)((int)local_70 + 0x1000);
                              } while (uVar12 <= (uint)local_80);
LAB_0012d0dc:
                              sqlite3_free(aFrame);
                              if (iVar5 == 0) goto LAB_0012d0ef;
                            }
                          }
                        }
                        else {
                          iVar5 = 0xe;
                          sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xf5e9,
                                      "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8"
                                     );
                        }
                        goto LAB_0012d1c1;
                      }
                    }
                  }
                }
LAB_0012d0ef:
                *(undefined8 *)(pWal->hdr).aFrameCksum = local_98;
                walIndexWriteHdr(pWal);
                puVar11 = *pWal->apWiData;
                lVar9 = 0;
                puVar11[0x18] = 0;
                puVar11[0x20] = (pWal->hdr).mxFrame;
                puVar11[0x19] = 0;
                do {
                  if (pWal->exclusiveMode == '\0') {
                    iVar5 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,(int)lVar9 + 4,1,10);
                    if (iVar5 != 5) {
                      if (iVar5 == 0) goto LAB_0012d151;
                      goto LAB_0012d1c1;
                    }
                  }
                  else {
LAB_0012d151:
                    if ((lVar9 == 0) && (uVar2 = (pWal->hdr).mxFrame, uVar2 != 0)) {
                      puVar11[0x1a] = uVar2;
                    }
                    else {
                      puVar11[lVar9 + 0x1a] = 0xffffffff;
                    }
                    iVar5 = 0;
                    if (pWal->exclusiveMode == '\0') {
                      (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,(int)lVar9 + 4,1,9);
                    }
                  }
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 4);
                if ((pWal->hdr).nPage != 0) {
                  sqlite3_log(0x11b,"recovered %d frames from WAL file %s",
                              (ulong)(pWal->hdr).mxFrame,pWal->zWalName);
                }
              }
LAB_0012d1c1:
              if (pWal->exclusiveMode == '\0') {
                (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar6,iVar14,9);
              }
            }
            *pChanged = 1;
            bVar16 = false;
          }
        }
        if ((uVar1 == '\0') && (pWal->writeLock = '\0', pWal->exclusiveMode == '\0')) {
          (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,9);
        }
        if (bVar16) goto LAB_0012d20e;
      }
    }
LAB_0012d217:
    if (pWal->bShmUnreliable == '\0') goto LAB_0012d294;
    if (iVar5 == 0) {
      iVar6 = 0;
    }
    else {
      walIndexClose(pWal,0);
      pWal->bShmUnreliable = '\0';
      iVar6 = -1;
      if (iVar5 != 0x20a) {
        iVar6 = iVar5;
      }
    }
  }
  else {
    local_c0 = *pWal->apWiData;
    iVar5 = 0;
    if (local_c0 == (u32 *)0x0) goto LAB_0012c9b7;
LAB_0012c9f1:
    iVar6 = walIndexTryHdr(pWal,pChanged);
    if (iVar6 != 0) goto LAB_0012ca04;
LAB_0012d20e:
    if ((pWal->hdr).iVersion == 0x2de218) goto LAB_0012d217;
    iVar5 = 0xe;
    sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xfa74,
                "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
    if (pWal->bShmUnreliable == '\0') goto LAB_0012d294;
    walIndexClose(pWal,0);
    pWal->bShmUnreliable = '\0';
    iVar6 = 0xe;
  }
  iVar5 = iVar6;
  pWal->exclusiveMode = '\0';
LAB_0012d294:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

static int walIndexReadHdr(Wal *pWal, int *pChanged){
  int rc;                         /* Return code */
  int badHdr;                     /* True if a header read failed */
  volatile u32 *page0;            /* Chunk of wal-index containing header */

  /* Ensure that page 0 of the wal-index (the page that contains the
  ** wal-index header) is mapped. Return early if an error occurs here.
  */
  assert( pChanged );
  rc = walIndexPage(pWal, 0, &page0);
  if( rc!=SQLITE_OK ){
    assert( rc!=SQLITE_READONLY ); /* READONLY changed to OK in walIndexPage */
    if( rc==SQLITE_READONLY_CANTINIT ){
      /* The SQLITE_READONLY_CANTINIT return means that the shared-memory
      ** was openable but is not writable, and this thread is unable to
      ** confirm that another write-capable connection has the shared-memory
      ** open, and hence the content of the shared-memory is unreliable,
      ** since the shared-memory might be inconsistent with the WAL file
      ** and there is no writer on hand to fix it. */
      assert( page0==0 );
      assert( pWal->writeLock==0 );
      assert( pWal->readOnly & WAL_SHM_RDONLY );
      pWal->bShmUnreliable = 1;
      pWal->exclusiveMode = WAL_HEAPMEMORY_MODE;
      *pChanged = 1;
    }else{
      return rc; /* Any other non-OK return is just an error */
    }
  }else{
    /* page0 can be NULL if the SHM is zero bytes in size and pWal->writeLock
    ** is zero, which prevents the SHM from growing */
    testcase( page0!=0 );
  }
  assert( page0!=0 || pWal->writeLock==0 );

  /* If the first page of the wal-index has been mapped, try to read the
  ** wal-index header immediately, without holding any lock. This usually
  ** works, but may fail if the wal-index header is corrupt or currently
  ** being modified by another thread or process.
  */
  badHdr = (page0 ? walIndexTryHdr(pWal, pChanged) : 1);

  /* If the first attempt failed, it might have been due to a race
  ** with a writer.  So get a WRITE lock and try again.
  */
  if( badHdr ){
    if( pWal->bShmUnreliable==0 && (pWal->readOnly & WAL_SHM_RDONLY) ){
      if( SQLITE_OK==(rc = walLockShared(pWal, WAL_WRITE_LOCK)) ){
        walUnlockShared(pWal, WAL_WRITE_LOCK);
        rc = SQLITE_READONLY_RECOVERY;
      }
    }else{
      int bWriteLock = pWal->writeLock;
      if( bWriteLock || SQLITE_OK==(rc = walLockWriter(pWal)) ){
        pWal->writeLock = 1;
        if( SQLITE_OK==(rc = walIndexPage(pWal, 0, &page0)) ){
          badHdr = walIndexTryHdr(pWal, pChanged);
          if( badHdr ){
            /* If the wal-index header is still malformed even while holding
            ** a WRITE lock, it can only mean that the header is corrupted and
            ** needs to be reconstructed.  So run recovery to do exactly that.
            */
            rc = walIndexRecover(pWal);
            *pChanged = 1;
          }
        }
        if( bWriteLock==0 ){
          pWal->writeLock = 0;
          walUnlockExclusive(pWal, WAL_WRITE_LOCK, 1);
        }
      }
    }
  }

  /* If the header is read successfully, check the version number to make
  ** sure the wal-index was not constructed with some future format that
  ** this version of SQLite cannot understand.
  */
  if( badHdr==0 && pWal->hdr.iVersion!=WALINDEX_MAX_VERSION ){
    rc = SQLITE_CANTOPEN_BKPT;
  }
  if( pWal->bShmUnreliable ){
    if( rc!=SQLITE_OK ){
      walIndexClose(pWal, 0);
      pWal->bShmUnreliable = 0;
      assert( pWal->nWiData>0 && pWal->apWiData[0]==0 );
      /* walIndexRecover() might have returned SHORT_READ if a concurrent
      ** writer truncated the WAL out from under it.  If that happens, it
      ** indicates that a writer has fixed the SHM file for us, so retry */
      if( rc==SQLITE_IOERR_SHORT_READ ) rc = WAL_RETRY;
    }
    pWal->exclusiveMode = WAL_NORMAL_MODE;
  }

  return rc;
}